

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O1

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
dealloc_local_slabs<false>
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          smallsizeclass_t sizeclass)

{
  undefined2 uVar1;
  undefined2 uVar2;
  Node *pNVar3;
  SlabMetadataCache *pSVar4;
  Alloc<void> alloc;
  Node *pNVar5;
  Node *meta;
  
  pNVar5 = (Node *)(this->alloc_classes + sizeclass);
  meta = (((SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *)
          &pNVar5->next)->head).next;
  if (meta != pNVar5) {
    pSVar4 = this->alloc_classes + sizeclass;
    do {
      pNVar3 = meta->next;
      if (*(short *)((long)&meta[3].next + 4) == 0) {
        uVar1 = pSVar4->unused;
        uVar2 = pSVar4->length;
        pSVar4->unused = uVar1 + -1;
        pSVar4->length = uVar2 + -1;
        pNVar3->prev = meta->prev;
        meta->prev->next = pNVar3;
        alloc = clear_slab(this,(BackendSlabMetadata *)meta,sizeclass);
        BackendAllocator<snmalloc::PALLinux,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_snmalloc::DummyAuthmap,_snmalloc::MetaProtectedRangeLocalState<snmalloc::PALLinux,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>,_14UL>_>
        ::dealloc_chunk(&this->backend_state,(SlabMetadata *)meta,alloc,
                        *(long *)(sizeclass_metadata +
                                 (ulong)(((uint)sizeclass & 0x7f ^ 0x40) << 5) + 8) + 1,
                        (sizeclass_t)(sizeclass + 0x40));
      }
      meta = pNVar3;
    } while (pNVar3 != pNVar5);
  }
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void dealloc_local_slabs(smallsizeclass_t sizeclass)
    {
      // Return unused slabs of sizeclass_t back to global allocator
      alloc_classes[sizeclass].available.iterate([this, sizeclass](auto* meta) {
        auto domesticate =
          [this](freelist::QueuePtr p) SNMALLOC_FAST_PATH_LAMBDA {
            auto res = capptr_domesticate<Config>(backend_state_ptr(), p);
#ifdef SNMALLOC_TRACING
            if (res.unsafe_ptr() != p.unsafe_ptr())
              printf(
                "Domesticated %p to %p!\n", p.unsafe_ptr(), res.unsafe_ptr());
#endif
            return res;
          };

        if (meta->needed() != 0)
        {
          if (check_slabs)
          {
            meta->free_queue.validate(
              freelist::Object::key_root, meta->as_key_tweak(), domesticate);
          }
          return;
        }

        alloc_classes[sizeclass].length--;
        alloc_classes[sizeclass].unused--;

        // Remove from the list.  This must be done before dealloc chunk
        // as that may corrupt the node.
        meta->node.remove();

        // TODO delay the clear to the next user of the slab, or teardown so
        // don't touch the cache lines at this point in snmalloc_check_client.
        auto start = clear_slab(meta, sizeclass);

        Config::Backend::dealloc_chunk(
          get_backend_local_state(),
          *meta,
          start,
          sizeclass_to_slab_size(sizeclass),
          sizeclass_t::from_small_class(sizeclass));
      });
    }